

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O0

bool is_valid(CameraPose *pose,
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *x,vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *X)

{
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pMVar1;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDX;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  int __x;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  double extraout_XMM0_Qa;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar2;
  double res;
  Vector3d z;
  int k;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff70;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_ffffffffffffff78;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    this = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(long)local_24;
    pMVar1 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::size(in_RSI);
    if (pMVar1 <= this) {
      return true;
    }
    other = in_RDI;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDX,(long)local_24);
    PVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(this,other);
    this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar2.m_lhs;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)this,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)other);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RSI,(long)local_24);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized(this_00);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized(this_00);
    __x = (int)&stack0xffffffffffffff70;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,other);
    std::abs(__x);
    if (1e-08 < extraout_XMM0_Qa) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool is_valid(const CameraPose &pose, const std::vector<Eigen::Vector3d> &x, const std::vector<Eigen::Vector3d> &X) {
    for(int k = 0; k < x.size(); ++k) {
        Eigen::Vector3d z = pose.R * X[k] + pose.t;
        double res = std::abs(1 - x[k].normalized().dot(z.normalized()));
        if(res > 1e-8) {        
            return false;
        }
    }
    return true;
}